

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::
NinjaCommandTask::provideValue(llbuild::core::TaskInterface,unsigned_long,llbuild::core::
KeyType_const&,std::vector<unsigned_char,std::allocator<unsigned_char>_>_const__
          (void *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,ValueType *valueData)

{
  BuildContext *this_00;
  bool bVar1;
  vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *this_01;
  const_reference ppNVar2;
  FileInfo *this_02;
  FileInfo *outputInfo;
  BuildValue value;
  ValueType *valueData_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  NinjaCommandTask *this_local;
  TaskInterface param_1_local;
  
  value.commandHash.value = (uint64_t)valueData;
  anon_unknown.dwarf_83ee8::BuildValue::fromValue((BuildValue *)&outputInfo,valueData);
  bVar1 = anon_unknown.dwarf_83ee8::BuildValue::hasMultipleOutputs((BuildValue *)&outputInfo);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = anon_unknown.dwarf_83ee8::BuildValue::isExistingInput((BuildValue *)&outputInfo);
    if ((bVar1) ||
       (bVar1 = anon_unknown.dwarf_83ee8::BuildValue::isSuccessfulCommand((BuildValue *)&outputInfo)
       , bVar1)) {
      this_02 = anon_unknown.dwarf_83ee8::BuildValue::getOutputInfo((BuildValue *)&outputInfo);
      bVar1 = llbuild::basic::FileInfo::isMissing(this_02);
      if (bVar1) {
        *(undefined1 *)((long)this + 0x1a) = 0;
      }
      else {
        bVar1 = llbuild::basic::FileTimestamp::operator>
                          (&this_02->modTime,(FileTimestamp *)((long)this + 0x28));
        if (bVar1) {
          *(uint64_t *)((long)this + 0x28) = (this_02->modTime).seconds;
          *(uint64_t *)((long)this + 0x30) = (this_02->modTime).nanoseconds;
        }
      }
    }
    else {
      *(undefined1 *)((long)this + 0x18) = 1;
      bVar1 = anon_unknown.dwarf_83ee8::BuildValue::isMissingInput((BuildValue *)&outputInfo);
      if (bVar1) {
        *(undefined1 *)((long)this + 0x19) = 1;
        this_00 = *(BuildContext **)((long)this + 8);
        this_01 = llbuild::ninja::Command::getInputs(*(Command **)((long)this + 0x10));
        ppNVar2 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::
                  operator[](this_01,inputID);
        anon_unknown.dwarf_83ee8::BuildContext::reportMissingInput(this_00,*ppNVar2);
      }
    }
    anon_unknown.dwarf_83ee8::BuildValue::~BuildValue((BuildValue *)&outputInfo);
    return;
  }
  __assert_fail("!value.hasMultipleOutputs()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                ,0x3e0,
                "virtual void (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::provideValue(core::TaskInterface, uintptr_t, const core::KeyType &, const core::ValueType &)"
               );
}

Assistant:

virtual void provideValue(core::TaskInterface, uintptr_t inputID,
                              const core::KeyType& key, const core::ValueType& valueData) override {
      // Process the input value to see if we should skip this command.
      BuildValue value = BuildValue::fromValue(valueData);

      // All direct inputs to NinjaCommandTask objects should be singleton
      // values.
      assert(!value.hasMultipleOutputs());

      // If the value is not an existing input or a successful command, then we
      // shouldn't run this command.
      if (!value.isExistingInput() && !value.isSuccessfulCommand()) {
        shouldSkip = true;
        if (value.isMissingInput()) {
          hasMissingInput = true;

          context.reportMissingInput(command->getInputs()[inputID]);
        }
      } else {
        // Otherwise, track the information used to determine if we can just
        // update the command instead of running it.
        const FileInfo& outputInfo = value.getOutputInfo();

        // If there is a missing input file (from a successful command), we
        // always need to run the command.
        if (outputInfo.isMissing()) {
          canUpdateIfNewer = false;
        } else {
          // Otherwise, keep track of the newest input.
          if (outputInfo.modTime > newestModTime) {
            newestModTime = outputInfo.modTime;
          }
        }
      }
    }